

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O1

int MMDB_vget_value(MMDB_entry_s *start,MMDB_entry_data_s *entry_data,__va_list_tag *va_path)

{
  uint uVar1;
  int iVar2;
  char **path;
  ulong uVar3;
  long *plVar4;
  long *plVar5;
  long lVar6;
  va_list path_copy;
  uint local_38;
  
  uVar1 = va_path->gp_offset;
  plVar5 = (long *)va_path->overflow_arg_area;
  lVar6 = 0;
  do {
    if (uVar1 < 0x29) {
      uVar3 = (ulong)uVar1;
      uVar1 = uVar1 + 8;
      plVar4 = (long *)(uVar3 + (long)va_path->reg_save_area);
    }
    else {
      plVar4 = plVar5;
      plVar5 = plVar5 + 1;
    }
    lVar6 = lVar6 + -1;
  } while (*plVar4 != 0);
  if (lVar6 == 0) {
    iVar2 = 3;
  }
  else {
    path = (char **)calloc(-lVar6,8);
    if (path == (char **)0x0) {
      iVar2 = 5;
    }
    else {
      uVar1 = va_path->gp_offset;
      uVar3 = 0;
      while( true ) {
        if (uVar1 < 0x29) {
          plVar5 = (long *)((ulong)uVar1 + (long)va_path->reg_save_area);
          uVar1 = uVar1 + 8;
          va_path->gp_offset = uVar1;
        }
        else {
          plVar5 = (long *)va_path->overflow_arg_area;
          va_path->overflow_arg_area = plVar5 + 1;
        }
        if ((char *)*plVar5 == (char *)0x0) break;
        path[uVar3] = (char *)*plVar5;
        uVar3 = uVar3 + 1;
      }
      path[uVar3 & 0xffffffff] = (char *)0x0;
      iVar2 = MMDB_aget_value(start,entry_data,path);
      free(path);
    }
  }
  return iVar2;
}

Assistant:

int MMDB_vget_value(MMDB_entry_s *const start,
                    MMDB_entry_data_s *const entry_data,
                    va_list va_path) {
    size_t length = path_length(va_path);
    const char *path_elem;
    int i = 0;

    if (length == SIZE_MAX) {
        return MMDB_INVALID_METADATA_ERROR;
    }

    const char **path = calloc(length + 1, sizeof(const char *));
    if (NULL == path) {
        return MMDB_OUT_OF_MEMORY_ERROR;
    }

    while (NULL != (path_elem = va_arg(va_path, char *))) {
        path[i] = path_elem;
        i++;
    }
    path[i] = NULL;

    int status = MMDB_aget_value(start, entry_data, path);

    free(path);

    return status;
}